

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O2

void test_archive_string_update_utf8_win(void)

{
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                 ,L'Υ');
  test_skipping("This test is meant to verify unicode string handling on Windows with the C locale")
  ;
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_update_utf8_win)
{
#if !defined(_WIN32) || defined(__CYGWIN__)
	skipping("This test is meant to verify unicode string handling on Windows"
	    " with the C locale");
#else
	static const char utf8_string[] = "\xD0\xBF\xD1\x80\xD0\xB8";
	static const wchar_t wcs_string[] = L"\U0000043f\U00000440\U00000438";
	struct archive_mstring mstr;
	int r;

	memset(&mstr, 0, sizeof(mstr));

	r = archive_mstring_update_utf8(NULL, &mstr, utf8_string);

	/* On Windows, this should reliably fail with the C locale */
	assertEqualInt(-1, r);
	assertEqualInt(0, mstr.aes_set & AES_SET_MBS);

	/* NOTE: We access the internals to validate that they were set by the
	 *       'archive_mstring_update_utf8' function */
	/* UTF-8 should always be set */
	assertEqualInt(AES_SET_UTF8, mstr.aes_set & AES_SET_UTF8);
	assertEqualString(utf8_string, mstr.aes_utf8.s);
	/* WCS should always be set as well */
	assertEqualInt(AES_SET_WCS, mstr.aes_set & AES_SET_WCS);
	assertEqualWString(wcs_string, mstr.aes_wcs.s);

	archive_mstring_clean(&mstr);
#endif
}